

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::MID(Parser *this)

{
  Lex *this_00;
  Lex *pLVar1;
  lex_t lVar2;
  int iVar3;
  ostream *poVar4;
  Lex local_24;
  
  HIGH(this);
  lVar2 = this->c_type;
  if (((ulong)lVar2 < 0x23) && ((0x70c400000U >> ((ulong)lVar2 & 0x3f) & 1) != 0)) {
    Lex::Lex(&local_24,lVar2,0,0);
    std::deque<Lex,_std::allocator<Lex>_>::emplace_back<Lex>(&(this->lex_stack).c,&local_24);
    Lex::~Lex(&local_24);
    pLVar1 = (this->index)._M_current;
    this_00 = &this->c_lex;
    iVar3 = pLVar1->value;
    (this->c_lex).type = pLVar1->type;
    (this->c_lex).value = iVar3;
    (this->c_lex).add_value = pLVar1->add_value;
    lVar2 = Lex::get_type(this_00);
    this->c_type = lVar2;
    iVar3 = Lex::get_value(this_00);
    this->c_val = iVar3;
    iVar3 = Lex::get_add_value(this_00);
    this->c_add_val = iVar3;
    (this->index)._M_current = (this->index)._M_current + 1;
    if (DEBUG_MODE != 0) {
      poVar4 = operator<<((ostream *)&std::cout,this_00);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    HIGH(this);
    check_op(this);
  }
  return;
}

Assistant:

void Parser::MID(){
    HIGH();
    if (c_type == LEX_EQ || c_type == LEX_LSS || c_type == LEX_GTR ||
         c_type == LEX_LEQ || c_type == LEX_GEQ || c_type == LEX_NEQ)
    {
        lex_stack.push (c_type);
        get_lex();
        HIGH();
        check_op();
    }
}